

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int moveToRightmost(BtCursor *pCur)

{
  undefined2 uVar1;
  MemPage *pMVar2;
  int rc;
  u32 newPgno;
  int iVar3;
  MemPage *pPage;
  
  do {
    pMVar2 = pCur->pPage;
    if (pMVar2->leaf != '\0') {
      uVar1 = pMVar2->nCell;
      pCur->ix = uVar1 - 1;
      return 0;
    }
    newPgno = sqlite3Get4byte(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
    pCur->ix = pMVar2->nCell;
    iVar3 = moveToChild(pCur,newPgno);
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

static int moveToRightmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage = 0;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( !(pPage = pCur->pPage)->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCur->ix = pPage->nCell;
    rc = moveToChild(pCur, pgno);
    if( rc ) return rc;
  }
  pCur->ix = pPage->nCell-1;
  assert( pCur->info.nSize==0 );
  assert( (pCur->curFlags & BTCF_ValidNKey)==0 );
  return SQLITE_OK;
}